

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O3

void __thiscall leveldb::Table::ReadFilter(Table *this,Slice *filter_handle_value)

{
  Rep *pRVar1;
  FilterBlockReader *this_00;
  char *pcVar2;
  long in_FS_OFFSET;
  ReadOptions opt;
  BlockHandle filter_handle;
  Slice v;
  BlockContents block;
  char *local_70;
  ReadOptions local_68;
  Slice local_58;
  char *local_48;
  size_t sStack_40;
  BlockContents local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = filter_handle_value->data_;
  sStack_40 = filter_handle_value->size_;
  local_58.data_._0_4_ = 0xffffffff;
  local_58.data_._4_4_ = 0xffffffff;
  local_58.size_._0_4_ = 0xffffffff;
  local_58.size_._4_4_ = 0xffffffff;
  BlockHandle::DecodeFrom((BlockHandle *)&local_38,&local_58);
  pcVar2 = local_38.data.data_;
  if (local_38.data.data_ == (char *)0x0) {
    local_68.verify_checksums = false;
    local_68.fill_cache = true;
    local_68.snapshot = (Snapshot *)0x0;
    if ((this->rep_->options).paranoid_checks == true) {
      local_68.verify_checksums = true;
      local_68.fill_cache = true;
    }
    local_38.data.data_ = "";
    local_38.data.size_ = 0;
    ReadBlock((leveldb *)&local_70,this->rep_->file,&local_68,(BlockHandle *)&local_58,&local_38);
    pcVar2 = local_70;
    if (local_70 == (char *)0x0) {
      pRVar1 = this->rep_;
      if (local_38.heap_allocated == true) {
        pRVar1->filter_data = local_38.data.data_;
      }
      this_00 = (FilterBlockReader *)operator_new(0x28);
      FilterBlockReader::FilterBlockReader(this_00,(pRVar1->options).filter_policy,&local_38.data);
      this->rep_->filter = this_00;
      goto LAB_0064f43a;
    }
  }
  operator_delete__(pcVar2);
LAB_0064f43a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Table::ReadFilter(const Slice& filter_handle_value) {
  Slice v = filter_handle_value;
  BlockHandle filter_handle;
  if (!filter_handle.DecodeFrom(&v).ok()) {
    return;
  }

  // We might want to unify with ReadBlock() if we start
  // requiring checksum verification in Table::Open.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents block;
  if (!ReadBlock(rep_->file, opt, filter_handle, &block).ok()) {
    return;
  }
  if (block.heap_allocated) {
    rep_->filter_data = block.data.data();  // Will need to delete later
  }
  rep_->filter = new FilterBlockReader(rep_->options.filter_policy, block.data);
}